

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakels_main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  allocator<char> local_1b9;
  __uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
  local_1b8;
  string local_1b0;
  stdio_transporter local_190;
  undefined1 local_160 [48];
  undefined1 local_130 [16];
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [224];
  
  std::ios::rdbuf((streambuf *)((long)&std::cout + *(long *)(std::cout + -0x18)));
  local_130._8_4_ = Verbosity_OFF;
  local_120._M_p = (pointer)&local_110;
  local_118 = 0;
  local_110._M_local_buf[0] = '\0';
  local_130._0_4_ = 0;
  local_100._0_4_ = Verbosity_9;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_100 + 8),"cmakels.log",(allocator<char> *)&local_1b8);
  lscpp::logger_config::operator=((logger_config *)(local_130 + 8),(logger_config *)local_100);
  std::__cxx11::string::~string((string *)(local_100 + 8));
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,argv[1],&local_1b9);
    cmakels::cmake_language_server::cmake_language_server
              ((cmake_language_server *)local_100,&local_1b0);
    lscpp::launch_config::launch_config((launch_config *)local_160,(launch_config *)local_130);
    lscpp::stdio_transporter::stdio_transporter(&local_190,false);
    lscpp::transporter::transporter<lscpp::stdio_transporter>((transporter *)&local_1b8,&local_190);
    lscpp::launch((lsp_server *)local_100,(launch_config *)local_160,(transporter *)&local_1b8);
    if (local_1b8._M_t.
        super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
        .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
         )0x0) {
      (*(*(_func_int ***)
          local_1b8._M_t.
          super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
          .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl)[1])();
    }
    local_1b8._M_t.
    super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
    .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl =
         (tuple<lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>)
         (_Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
          )0x0;
    lscpp::stdio_transporter::~stdio_transporter(&local_190);
    std::__cxx11::string::~string((string *)(local_160 + 0x10));
    cmakels::cmake_language_server::~cmake_language_server((cmake_language_server *)local_100);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_120);
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage ");
  poVar1 = std::operator<<(poVar1,*argv);
  poVar1 = std::operator<<(poVar1," <build-dir>\n\n");
  poVar1 = std::operator<<(poVar1,
                           "<build-dir> - build directory relative to workspace root (usually defined by an IDE)"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {
  // Redirect std::cout to std::cerr to ensure that  cmake doesn't write to
  // stdout and messes up with lsp communication.
  // IMPORTANT: we must never use std::cout for lsp communication!
  std::cout.rdbuf(std::cerr.rdbuf());

  lscpp::launch_config config;
#ifndef NDEBUG
  config.startup_delay = 0;
#endif
  config.logger = {lscpp::Verbosity_MAX, "cmakels.log"};

  if (argc < 2) {
    std::cerr << "Usage " << argv[0] << " <build-dir>\n\n"
              << "<build-dir> - build directory relative to workspace root "
                 "(usually defined by an IDE)"
              << std::endl;
    std::exit(1);
  } else {
    lscpp::launch(cmakels::cmake_language_server{argv[1]}, config,
                  lscpp::stdio_transporter{false});
  }
}